

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sun.cpp
# Opt level: O2

ON_Sun * __thiscall ON_Sun::operator=(ON_Sun *this,ON_Sun *sun)

{
  CImpl *pCVar1;
  CImpl *pCVar2;
  double dVar3;
  bool bVar4;
  int minutes;
  int d;
  int m;
  int y;
  double h;
  int local_44;
  int local_40;
  int local_3c;
  double local_38;
  
  if (this != sun) {
    bVar4 = EnableOn(sun);
    SetEnableOn(this,bVar4);
    bVar4 = EnableAllowed(sun);
    SetEnableAllowed(this,bVar4);
    bVar4 = EnableOn(sun);
    SetEnableOn(this,bVar4);
    bVar4 = ManualControlAllowed(sun);
    SetManualControlAllowed(this,bVar4);
    bVar4 = ManualControlOn(sun);
    SetManualControlOn(this,bVar4);
    dVar3 = North(sun);
    SetNorth(this,dVar3);
    bVar4 = DaylightSavingOn(sun);
    SetDaylightSavingOn(this,bVar4);
    minutes = DaylightSavingMinutes(sun);
    SetDaylightSavingMinutes(this,minutes);
    dVar3 = Azimuth(sun);
    SetAzimuth(this,dVar3);
    dVar3 = Altitude(sun);
    SetAltitude(this,dVar3);
    dVar3 = Latitude(sun);
    SetLatitude(this,dVar3);
    dVar3 = Longitude(sun);
    SetLongitude(this,dVar3);
    dVar3 = TimeZone(sun);
    SetTimeZone(this,dVar3);
    dVar3 = Intensity(sun);
    SetIntensity(this,dVar3);
    dVar3 = ShadowIntensity(sun);
    SetShadowIntensity(this,dVar3);
    local_3c = 0;
    local_40 = 0;
    local_44 = 0;
    local_38 = 0.0;
    LocalDateTime(sun,&local_3c,&local_40,&local_44,&local_38);
    SetLocalDateTime(this,local_3c,local_40,local_44,local_38);
    pCVar1 = sun->_impl;
    pCVar2 = this->_impl;
    dVar3 = pCVar1->_altitude;
    pCVar2->_azimuth = pCVar1->_azimuth;
    pCVar2->_altitude = dVar3;
    pCVar2->_calc_dirty = pCVar1->_calc_dirty;
  }
  return this;
}

Assistant:

const ON_Sun& ON_Sun::operator = (const ON_Sun& sun)
{
  if (this != &sun)
  {
    // When copying the object, we need to directly copy the underlying XML. So we can't allow
    // virtual overrides to execute because they might hide the real values we want to copy.
    ON_Sun::SetEnableOn             (sun.ON_Sun::EnableOn());
    ON_Sun::SetEnableAllowed        (sun.ON_Sun::EnableAllowed());
    ON_Sun::SetEnableOn             (sun.ON_Sun::EnableOn());
    ON_Sun::SetManualControlAllowed (sun.ON_Sun::ManualControlAllowed());
    ON_Sun::SetManualControlOn      (sun.ON_Sun::ManualControlOn());
    ON_Sun::SetNorth                (sun.ON_Sun::North());
    ON_Sun::SetDaylightSavingOn     (sun.ON_Sun::DaylightSavingOn());
    ON_Sun::SetDaylightSavingMinutes(sun.ON_Sun::DaylightSavingMinutes());
    ON_Sun::SetAzimuth              (sun.ON_Sun::Azimuth());
    ON_Sun::SetAltitude             (sun.ON_Sun::Altitude());
    ON_Sun::SetLatitude             (sun.ON_Sun::Latitude());
    ON_Sun::SetLongitude            (sun.ON_Sun::Longitude());
    ON_Sun::SetTimeZone             (sun.ON_Sun::TimeZone());
    ON_Sun::SetIntensity            (sun.ON_Sun::Intensity());
    ON_Sun::SetShadowIntensity      (sun.ON_Sun::ShadowIntensity());

    int y = 0, m = 0, d = 0; double h = 0.0;
    sun.ON_Sun::LocalDateTime(y, m, d, h);
    ON_Sun::SetLocalDateTime(y, m, d, h);

    _impl->_azimuth    = sun._impl->_azimuth;
    _impl->_altitude   = sun._impl->_altitude;
    _impl->_calc_dirty = sun._impl->_calc_dirty;
  }

  return *this;
}